

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::FlushPages(PF_BufferMgr *this,int fd)

{
  int iVar1;
  RC RVar2;
  int local_28;
  int next;
  int slot;
  RC rcWarn;
  RC rc;
  int fd_local;
  PF_BufferMgr *this_local;
  
  next = 0;
  StatisticsMgr::Register(pStatisticsMgr,PF_FLUSHPAGES,STAT_ADDONE,(int *)0x0);
  iVar1 = this->first;
  do {
    while( true ) {
      do {
        local_28 = iVar1;
        if (local_28 == -1) {
          return next;
        }
        iVar1 = this->bufTable[local_28].next;
      } while (this->bufTable[local_28].fd != fd);
      if (this->bufTable[local_28].pinCount == 0) break;
      next = 1;
    }
    if (this->bufTable[local_28].bDirty != 0) {
      RVar2 = WritePage(this,fd,this->bufTable[local_28].pageNum,this->bufTable[local_28].pData);
      if (RVar2 != 0) {
        return RVar2;
      }
      this->bufTable[local_28].bDirty = 0;
    }
    slot = PF_HashTable::Delete(&this->hashTable,fd,this->bufTable[local_28].pageNum);
  } while (((slot == 0) && (slot = Unlink(this,local_28), slot == 0)) &&
          (slot = InsertFree(this,local_28), slot == 0));
  return slot;
}

Assistant:

RC PF_BufferMgr::FlushPages(int fd)
{
   RC rc, rcWarn = 0;  // return codes

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Flushing all pages for (%d).\n", fd);
   WriteLog(psMessage);
#endif

#ifdef PF_STATS
   pStatisticsMgr->Register(PF_FLUSHPAGES, STAT_ADDONE);
#endif

   // Do a linear scan of the buffer to find pages belonging to the file
   int slot = first;
   while (slot != INVALID_SLOT) {

      int next = bufTable[slot].next;

      // If the page belongs to the passed-in file descriptor
      if (bufTable[slot].fd == fd) {

#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is in buffer manager.\n", bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
         // Ensure the page is not pinned
         if (bufTable[slot].pinCount) {
            rcWarn = PF_PAGEPINNED;
         }
         else {
            // Write the page if dirty
            if (bufTable[slot].bDirty) {
#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is dirty\n",bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
               if ((rc = WritePage(fd, bufTable[slot].pageNum, bufTable[slot].pData)))
                  return (rc);
               bufTable[slot].bDirty = FALSE;
            }

            // Remove page from the hash table and add the slot to the free list
            if ((rc = hashTable.Delete(fd, bufTable[slot].pageNum)) ||
                  (rc = Unlink(slot)) ||
                  (rc = InsertFree(slot)))
               return (rc);
         }
      }
      slot = next;
   }

#ifdef PF_LOG
   WriteLog("All necessary pages flushed.\n");
#endif

   // Return warning or ok
   return (rcWarn);
}